

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void Engine::retrieve_assumption_nogood(vec<BoolView> *xs)

{
  uint index;
  uint uVar1;
  BoolView *this;
  int *piVar2;
  char *pcVar3;
  vec<BoolView> *this_00;
  BoolView *in_RDI;
  int ii_2;
  uint ii_1;
  int ii;
  Lit q;
  int assump_sz;
  vec<Lit> out_nogood;
  vec<Lit> *in_stack_000000e0;
  anon_class_1_0_00000001 *in_stack_000000e8;
  Lit in_stack_000000f4;
  vec<Lit> *in_stack_ffffffffffffff60;
  BoolView *elem;
  Lit p;
  uint local_58;
  uint local_40;
  uint local_34;
  vec<Lit> local_18;
  BoolView *local_8;
  
  local_8 = in_RDI;
  vec<Lit>::vec(&local_18);
  index = SAT::decisionLevel((SAT *)0x2817c8);
  p.x = index;
  this = (BoolView *)vec<int>::operator[](&engine.assumptions,index);
  toLit(0x2817ff);
  for (local_34 = 0; (int)local_34 < (int)index; local_34 = local_34 + 1) {
    piVar2 = vec<int>::operator[](&engine.assumptions,local_34);
    pcVar3 = vec<char>::operator[](&sat.seen,*piVar2 >> 1);
    *pcVar3 = '\x02';
  }
  pushback_reason_lazy<Engine::retrieve_assumption_nogood(vec<BoolView>&)::__0>
            (in_stack_000000e8,in_stack_000000f4,in_stack_000000e0);
  local_40 = 0;
  while( true ) {
    uVar1 = vec<Lit>::size(&local_18);
    if (uVar1 <= local_40) break;
    elem = local_8;
    this_00 = (vec<BoolView> *)vec<Lit>::operator[](&local_18,local_40);
    BoolView::BoolView(this,p);
    vec<BoolView>::push(this_00,elem);
    BoolView::~BoolView((BoolView *)0x281935);
    local_40 = local_40 + 1;
  }
  for (local_58 = 0; (int)local_58 < (int)index; local_58 = local_58 + 1) {
    in_stack_ffffffffffffff60 = (vec<Lit> *)vec<int>::operator[](&engine.assumptions,local_58);
    pcVar3 = vec<char>::operator[](&sat.seen,(int)in_stack_ffffffffffffff60->sz >> 1);
    *pcVar3 = '\x02';
  }
  vec<Lit>::~vec(in_stack_ffffffffffffff60);
  return;
}

Assistant:

void Engine::retrieve_assumption_nogood(vec<BoolView>& xs) {
	vec<Lit> out_nogood;
	const int assump_sz = sat.decisionLevel();
	assert(assump_sz < static_cast<int>(engine.assumptions.size()));

	const Lit q(toLit(engine.assumptions[assump_sz]));
	assert(sat.value(q) == l_False);

	// Mark the available assumptions
	for (int ii = 0; ii < assump_sz; ii++) {
		assert(sat.value(toLit(engine.assumptions[ii])) == l_True);
		sat.seen[engine.assumptions[ii] >> 1] = 2;
	}

	// Collect the nogood.
	// pushback_reason([](Lit p) { return sat.seen[var(p)]&2; }, q, out_nogood);
	pushback_reason_lazy([](Lit p) { return sat.seen[var(p)] & 2; }, q, out_nogood);

	for (unsigned int ii = 0; ii < out_nogood.size(); ii++) {
		xs.push(out_nogood[ii]);
	}

	// Finally, clear the marked assumptions
	for (int ii = 0; ii < assump_sz; ii++) {
		sat.seen[engine.assumptions[ii] >> 1] = 2;
	}
}